

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  ImGuiTabItem *pIVar2;
  ImGuiTabItem *pIVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImGuiTabItem *__src;
  float fVar7;
  float fVar8;
  ImGuiID IVar9;
  ImGuiTabItemFlags IVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ImGuiTabItem *__dest;
  long lVar17;
  ImGuiTabItem *tab;
  ImGuiTabItem item_tmp;
  undefined3 uStack_3b;
  undefined5 uStack_38;
  
  if (tab_bar->ReorderRequestTabId == 0) {
    return false;
  }
  lVar16 = (long)(tab_bar->Tabs).Size;
  if (0 < lVar16) {
    pIVar2 = (tab_bar->Tabs).Data;
    lVar17 = 0;
    tab = pIVar2;
    do {
      if (tab->ID == tab_bar->ReorderRequestTabId) {
        if ((tab->Flags & 0x20) != 0) {
          return false;
        }
        iVar12 = ImGuiTabBar::GetTabOrder(tab_bar,tab);
        iVar15 = (int)tab_bar->ReorderRequestOffset;
        uVar13 = iVar12 + iVar15;
        if ((int)uVar13 < 0) {
          return false;
        }
        if ((tab_bar->Tabs).Size <= (int)uVar13) {
          return false;
        }
        pIVar3 = (tab_bar->Tabs).Data;
        uVar1 = pIVar3[uVar13].Flags;
        if ((uVar1 & 0x20) != 0) {
          return false;
        }
        if (((uVar1 ^ tab->Flags) & 0xc0) != 0) {
          return false;
        }
        pIVar3 = pIVar3 + uVar13;
        uVar4._0_2_ = tab->BeginOrder;
        uVar4._2_2_ = tab->IndexDuringLayout;
        uVar4._4_1_ = tab->WantClose;
        uVar4._5_3_ = *(undefined3 *)&tab->field_0x25;
        uStack_38 = (undefined5)uVar4;
        IVar9 = tab->ID;
        IVar10 = tab->Flags;
        iVar12 = tab->LastFrameVisible;
        iVar11 = tab->LastFrameSelected;
        fVar7 = tab->Offset;
        fVar8 = tab->Width;
        uVar5 = tab->ContentWidth;
        uVar6 = tab->NameOffset;
        uStack_3b = (undefined3)((uint)uVar6 >> 8);
        __dest = pIVar3 + 1;
        __src = pIVar3;
        if (0 < tab_bar->ReorderRequestOffset) {
          __dest = tab;
          __src = (ImGuiTabItem *)((long)pIVar2 + (0x28 - lVar17));
        }
        iVar14 = -iVar15;
        if (0 < iVar15) {
          iVar14 = iVar15;
        }
        memmove(__dest,__src,(ulong)(uint)(iVar14 << 3) * 5);
        *(ulong *)((long)&pIVar3->NameOffset + 1) = CONCAT53(uStack_38,uStack_3b);
        pIVar3->Offset = fVar7;
        pIVar3->Width = fVar8;
        pIVar3->ContentWidth = (float)uVar5;
        pIVar3->NameOffset = uVar6;
        pIVar3->ID = IVar9;
        pIVar3->Flags = IVar10;
        pIVar3->LastFrameVisible = iVar12;
        pIVar3->LastFrameSelected = iVar11;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
      lVar17 = lVar17 + -0x28;
      tab = tab + 1;
    } while (lVar16 * 0x28 + lVar17 != 0);
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}